

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laser_tag.cpp
# Opt level: O3

Belief * __thiscall despot::LaserTag::InitialBelief(LaserTag *this,State *start,string type)

{
  int iVar1;
  int iVar2;
  StateIndexer *pSVar3;
  int iVar4;
  int opp;
  int iVar5;
  vector<despot::State_*,_std::allocator<despot::State_*>_> local_78;
  double local_58;
  vector<despot::State_*,_std::allocator<despot::State_*>_> local_50;
  State *local_38;
  
  local_78.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar1 = despot::Floor::NumCells();
  if (0 < iVar1) {
    local_58 = (1.0 / (double)iVar1) / (double)iVar1;
    iVar4 = 0;
    do {
      iVar5 = 0;
      do {
        iVar2 = despot::Floor::NumCells();
        local_38 = (State *)(**(code **)(*(long *)&this->super_BaseTag + 0xe0))
                                      (SUB84(local_58,0),this,iVar2 * iVar4 + iVar5);
        std::vector<despot::State*,std::allocator<despot::State*>>::emplace_back<despot::State*>
                  ((vector<despot::State*,std::allocator<despot::State*>> *)&local_78,&local_38);
        iVar5 = iVar5 + 1;
      } while (iVar1 != iVar5);
      iVar4 = iVar4 + 1;
    } while (iVar4 != iVar1);
  }
  pSVar3 = (StateIndexer *)operator_new(0x90);
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector(&local_50,&local_78);
  despot::ParticleBelief::ParticleBelief
            ((ParticleBelief *)pSVar3,&local_50,&(this->super_BaseTag).super_BeliefMDP,0,1);
  if (local_50.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.
                          super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.
                          super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  despot::ParticleBelief::state_indexer(pSVar3);
  if (local_78.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.
                          super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.
                          super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return (Belief *)pSVar3;
}

Assistant:

Belief* LaserTag::InitialBelief(const State* start, string type) const {
	//assert(start != NULL);

	vector<State*> particles;
	int N = floor_.NumCells();
	double wgt = 1.0 / N / N;
	for (int rob = 0; rob < N; rob++) {
		for (int opp = 0; opp < N; opp++) {
			TagState* state = static_cast<TagState*>(Allocate(
				RobOppIndicesToStateIndex(rob, opp), wgt));
			particles.push_back(state);
		}
	}

	ParticleBelief* belief = new ParticleBelief(particles, this);
	belief->state_indexer(this);
	return belief;
}